

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O2

int do_makedir(char *path)

{
  char cVar1;
  __mode_t __mask;
  int iVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  uint __mode;
  undefined1 local_d8 [8];
  stat sb;
  
  __s = adjustname(path,1);
  if (__s != (char *)0x0) {
    sVar4 = strlen(__s);
    pcVar5 = __s + sVar4;
    while ((pcVar5 = pcVar5 + -1, __s < pcVar5 && (*pcVar5 == '/'))) {
      *pcVar5 = '\0';
    }
    __mask = umask(0);
    sb.__glibc_reserved[2]._0_4_ = ~__mask & 0x1ff;
    sb.__glibc_reserved[2]._4_4_ = (uint)sb.__glibc_reserved[2] | 0xc0;
    pcVar5 = __s;
    while( true ) {
      sVar4 = strspn(pcVar5,"/");
      pcVar5 = pcVar5 + sVar4;
      sVar4 = strcspn(pcVar5,"/");
      cVar1 = pcVar5[sVar4];
      pcVar5[sVar4] = '\0';
      iVar2 = stat(__s,(stat *)local_d8);
      if (iVar2 == 0 && cVar1 == '\0') break;
      if (((iVar2 != 0) || (cVar1 == '\0')) || (((uint)sb.st_nlink & 0xf000) != 0x4000)) {
        __mode = (uint)sb.__glibc_reserved[2];
        if (cVar1 != '\0') {
          __mode = sb.__glibc_reserved[2]._4_4_;
        }
        iVar3 = mkdir(__s,__mode);
        if (iVar3 != 0) {
          if (iVar2 != 0) {
            dobeep();
            ewprintf("Creating directory: permission denied, %s",__s);
LAB_00109f76:
            umask(__mask);
            return 0;
          }
          if (((uint)sb.st_nlink & 0xf000) != 0x4000) {
            eerase();
            goto LAB_00109f76;
          }
        }
        if (cVar1 == '\0') {
          eerase();
          umask(__mask);
          return 1;
        }
      }
      pcVar5 = pcVar5 + sVar4;
      *pcVar5 = '/';
    }
    dobeep();
    ewprintf("Cannot create directory %s: file exists",__s);
  }
  return 0;
}

Assistant:

int
do_makedir(char *path)
{
	struct stat	 sb;
	int		 finished, ishere;
	mode_t		 dir_mode, f_mode, oumask;
	char		*slash;

	if ((path = adjustname(path, TRUE)) == NULL)
		return (FALSE);

	/* Remove trailing slashes */
	slash = strrchr(path, '\0');
	while (--slash > path && *slash == '/')
		*slash = '\0';

	slash = path;

	oumask = umask(0);
	f_mode = 0777 & ~oumask;
	dir_mode = f_mode | S_IWUSR | S_IXUSR;

	for (;;) {
		slash += strspn(slash, "/");
		slash += strcspn(slash, "/");

		finished = (*slash == '\0');
		*slash = '\0';

		ishere = !stat(path, &sb);
		if (finished && ishere) {
			dobeep();
			ewprintf("Cannot create directory %s: file exists",
			     path);
			return(FALSE);
		} else if (!finished && ishere && S_ISDIR(sb.st_mode)) {
			*slash = '/';
			continue;
		}

		if (mkdir(path, finished ? f_mode : dir_mode) == 0) {
			if (f_mode > 0777 && chmod(path, f_mode) == -1) {
				umask(oumask);
				return (ABORT);
			}
		} else {
			if (!ishere || !S_ISDIR(sb.st_mode)) {
				if (!ishere) {
					dobeep();
					ewprintf("Creating directory: "
					    "permission denied, %s", path);
				} else
					eerase();

				umask(oumask);
				return (FALSE);
			}
		}

		if (finished)
			break;

		*slash = '/';
	}

	eerase();
	umask(oumask);
	return (TRUE);
}